

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_remove_simple_key(yaml_parser_t *parser)

{
  yaml_simple_key_t *pyVar1;
  yaml_simple_key_t *simple_key;
  yaml_parser_t *parser_local;
  
  pyVar1 = (parser->simple_keys).top;
  if ((pyVar1[-1].possible == 0) || (pyVar1[-1].required == 0)) {
    pyVar1[-1].possible = 0;
    parser_local._4_4_ = 1;
  }
  else {
    parser_local._4_4_ =
         yaml_parser_set_scanner_error
                   (parser,"while scanning a simple key",pyVar1[-1].mark,
                    "could not find expected \':\'");
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_remove_simple_key(yaml_parser_t *parser)
{
    yaml_simple_key_t *simple_key = parser->simple_keys.top-1;

    if (simple_key->possible)
    {
        /* If the key is required, it is an error. */

        if (simple_key->required) {
            return yaml_parser_set_scanner_error(parser,
                    "while scanning a simple key", simple_key->mark,
                    "could not find expected ':'");
        }
    }

    /* Remove the key from the stack. */

    simple_key->possible = 0;

    return 1;
}